

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

int __thiscall
wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>::joinImpl<0ul,1ul>
          (Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice> *this,long joinee,long joiner)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = RandomFullLattice::join
                    ((RandomFullLattice *)(this + 0x10),(Element *)(joinee + 0x10),
                     (Element *)(joiner + 0x10));
  uVar2 = Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>::joinImpl<1UL>
                    ((Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice> *)this,joinee,joiner);
  return uVar2 | bVar1;
}

Assistant:

int joinImpl(Element& joinee,
               const Element& joiner,
               std::index_sequence<I, Is...>) const noexcept {
    // Recursive case: join the current element and recurse to the next
    // elements.
    return std::get<I>(lattices).join(std::get<I>(joinee),
                                      std::get<I>(joiner)) |
           joinImpl(joinee, joiner, std::index_sequence<Is...>{});
  }